

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metainformation.cpp
# Opt level: O0

void __thiscall
hbm::streaming::MetaInformation::MetaInformation
          (MetaInformation *this,SocketNonblocking *socket,size_t size)

{
  bool bVar1;
  uint32_t uVar2;
  ostream *poVar3;
  char *pcVar4;
  Value *root;
  reference pvVar5;
  ulong in_RDX;
  undefined8 in_RSI;
  uint32_t *in_RDI;
  Reader reader;
  vector<char,_std::allocator<char>_> data;
  size_t dataSize;
  int32_t typeBig;
  value_type_conflict *in_stack_fffffffffffffd98;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  Reader *in_stack_fffffffffffffda0;
  undefined8 in_stack_fffffffffffffda8;
  Value *in_stack_fffffffffffffdb0;
  size_type in_stack_fffffffffffffdb8;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffdc0;
  size_t in_stack_fffffffffffffdc8;
  void *in_stack_fffffffffffffdd0;
  SocketNonblocking *in_stack_fffffffffffffdd8;
  allocator *paVar6;
  Reader *in_stack_fffffffffffffde0;
  undefined1 collectComments;
  allocator<char> *beginDoc;
  Reader *in_stack_fffffffffffffe28;
  string local_1b0 [39];
  allocator local_189;
  string local_188 [144];
  Reader *in_stack_ffffffffffffff08;
  allocator<char> local_51;
  vector<char,_std::allocator<char>_> local_50;
  char *local_38;
  uint32_t local_1c;
  ulong local_18;
  undefined1 uStack_9;
  
  uStack_9 = (undefined1)((ulong)in_RSI >> 0x38);
  *in_RDI = 0;
  local_18 = in_RDX;
  Json::Value::Value(in_stack_fffffffffffffdb0,(ValueType)((ulong)in_stack_fffffffffffffda8 >> 0x20)
                    );
  memset(in_RDI + 0xc,0,0x18);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x141d45);
  if (local_18 < 5) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"MetaInformation");
    poVar3 = std::operator<<(poVar3,": invalid size");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  else {
    SocketNonblocking::receiveComplete
              (in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
    uVar2 = ntohl(local_1c);
    *in_RDI = uVar2;
    if (*in_RDI == 1) {
      pcVar4 = (char *)(local_18 - 4);
      beginDoc = &local_51;
      local_38 = pcVar4;
      std::allocator<char>::allocator();
      std::vector<char,_std::allocator<char>_>::vector
                (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
                 (allocator_type *)in_stack_fffffffffffffdb0);
      std::allocator<char>::~allocator(&local_51);
      collectComments = uStack_9;
      root = (Value *)std::vector<char,_std::allocator<char>_>::operator[](&local_50,0);
      std::vector<char,_std::allocator<char>_>::size(&local_50);
      SocketNonblocking::receiveComplete
                (in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
      std::vector<char,_std::allocator<char>_>::push_back
                ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffda0,
                 in_stack_fffffffffffffd98);
      Json::Reader::Reader(in_stack_fffffffffffffde0);
      std::vector<char,_std::allocator<char>_>::operator[](&local_50,0);
      std::vector<char,_std::allocator<char>_>::operator[](&local_50,(size_type)local_38);
      bVar1 = Json::Reader::parse(in_stack_fffffffffffffe28,(char *)beginDoc,pcVar4,root,
                                  (bool)collectComments);
      if (!bVar1) {
        poVar3 = std::operator<<((ostream *)&std::cerr,"parsing meta \'");
        pvVar5 = std::vector<char,_std::allocator<char>_>::operator[](&local_50,0);
        paVar6 = &local_189;
        pcVar4 = local_38;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_188,pvVar5,(ulong)pcVar4,paVar6);
        poVar3 = std::operator<<(poVar3,local_188);
        poVar3 = std::operator<<(poVar3,"\'information failed : ");
        Json::Reader::getFormattedErrorMessages_abi_cxx11_(in_stack_ffffffffffffff08);
        in_stack_fffffffffffffdb0 = (Value *)std::operator<<(poVar3,local_1b0);
        std::ostream::operator<<(in_stack_fffffffffffffdb0,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string(local_1b0);
        std::__cxx11::string::~string(local_188);
        std::allocator<char>::~allocator((allocator<char> *)&local_189);
      }
      Json::Reader::~Reader(in_stack_fffffffffffffda0);
      std::vector<char,_std::allocator<char>_>::~vector
                ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffdb0);
    }
    else {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffdc0,
                 in_stack_fffffffffffffdb8);
      this_00 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0xc);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](this_00,0);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(this_00);
      SocketNonblocking::receiveComplete
                (in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
    }
  }
  return;
}

Assistant:

MetaInformation::MetaInformation(SocketNonblocking &socket, size_t size)
			: m_type(0)
			, m_jsonContent()
			, m_binaryContent()
		{
			int32_t typeBig;

			if (size<=sizeof(typeBig)) {
				std::cerr << __FUNCTION__ << ": invalid size" <<std::endl;
				return;
			}

			socket.receiveComplete(&typeBig, sizeof(typeBig));

			m_type = ntohl(typeBig);
			if(m_type==METAINFORMATION_JSON) {
				size_t dataSize = size-sizeof(m_type);
				std::vector < char > data(dataSize);
				socket.receiveComplete(&data[0], data.size());
				data.push_back('\0');

				Json::Reader reader;
				if(reader.parse(&data[0], &data[dataSize], m_jsonContent)==false) {
					std::cerr << "parsing meta '" << std::string(&data[0], dataSize) << "'information failed : " << reader.getFormattedErrorMessages() << std::endl;
				}

			} else {
				m_binaryContent.resize(size-sizeof(m_type));
				socket.receiveComplete(&m_binaryContent[0], m_binaryContent.size());
			}
		}